

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_merge_distr_patch
               (Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  logical lVar7;
  Integer IVar8;
  long lVar9;
  ulong uVar10;
  double *alpha;
  ulong uVar11;
  bool bVar12;
  double d_one;
  undefined8 uStack_190;
  Integer local_188;
  long local_180;
  long local_178;
  void *src_data_ptr;
  Integer mlo [7];
  Integer mhi [7];
  Integer dhi [7];
  Integer dlo [7];
  Integer mld [7];
  
  iVar4 = _ga_sync_end;
  bVar12 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar12) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"nga_merge_distr_patch");
  pnga_check_handle(g_b,"nga_merge_distr_patch");
  lVar7 = pnga_is_mirrored(g_a);
  if (lVar7 == 0) {
    IVar8 = pnga_cluster_nnodes();
    if (IVar8 < 2) {
      mlo[0]._0_2_ = 0x4e;
      pnga_copy_patch((char *)mlo,g_a,alo,ahi,g_b,blo,bhi);
      return;
    }
    pnga_error("Handle to a non-mirrored array passed",0);
  }
  lVar9 = g_a + 1000;
  lVar7 = pnga_is_mirrored(g_b);
  if ((lVar7 != 0) && (IVar8 = pnga_cluster_nnodes(), IVar8 != 0)) {
    pnga_error("Distributed array is mirrored",0);
  }
  uVar1 = GA[lVar9].ndim;
  uVar2 = GA[g_b + 1000].ndim;
  local_178 = (long)GA[lVar9].p_handle;
  if (uVar1 != uVar2) {
    pnga_error("Global arrays must have same dimension",0);
  }
  local_180 = (long)GA[lVar9].type;
  local_188 = g_b;
  if (GA[lVar9].type != GA[g_b + 1000].type) {
    pnga_error("Global arrays must be of same type",0);
  }
  uVar10 = 0;
  uVar5 = 0;
  if (0 < (short)uVar1) {
    uVar5 = uVar1;
  }
  uVar11 = (ulong)uVar5;
  for (; IVar8 = local_188, uVar11 != uVar10; uVar10 = uVar10 + 1) {
    lVar9 = alo[uVar10];
    if ((((lVar9 < 0) || (GA[g_a + 1000].dims[uVar10] <= lVar9)) ||
        (lVar3 = ahi[uVar10], lVar3 < lVar9)) ||
       ((lVar3 < 0 || (GA[g_a + 1000].dims[uVar10] <= lVar3)))) {
      pnga_error("Invalid patch index on mirrored GA",0);
    }
  }
  uVar10 = 0;
  uVar6 = 0;
  if (0 < (short)uVar2) {
    uVar6 = (uint)uVar2;
  }
  for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    lVar9 = blo[uVar10];
    if (((lVar9 < 0) || (GA[IVar8 + 1000].dims[uVar10] <= lVar9)) ||
       ((lVar3 = bhi[uVar10], lVar3 < lVar9 ||
        ((lVar3 < 0 || (GA[IVar8 + 1000].dims[uVar10] <= lVar3)))))) {
      pnga_error("Invalid patch index on distributed GA",0);
    }
  }
  for (uVar10 = 0; IVar8 = local_188, uVar6 != uVar10; uVar10 = uVar10 + 1) {
    if (ahi[uVar10] - alo[uVar10] != bhi[uVar10] - blo[uVar10]) {
      pnga_error("Patch dimensions do not match for index ",uVar10);
    }
  }
  pnga_zero_patch(local_188,blo,bhi);
  pnga_distribution(g_a,(long)PGRP_LIST[local_178].map_proc_list[GAme],mlo,mhi);
  bVar12 = true;
  for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    if (mhi[uVar10] < alo[uVar10]) {
      bVar12 = false;
    }
    if (ahi[uVar10] < mlo[uVar10]) {
      bVar12 = false;
    }
  }
  if (bVar12) {
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      lVar9 = mlo[uVar10];
      if (mlo[uVar10] < alo[uVar10]) {
        lVar9 = alo[uVar10];
      }
      mlo[uVar10] = lVar9;
      lVar9 = mhi[uVar10];
      if (ahi[uVar10] < mhi[uVar10]) {
        lVar9 = ahi[uVar10];
      }
      mhi[uVar10] = lVar9;
    }
    pnga_access_ptr(g_a,mlo,mhi,&src_data_ptr,mld);
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      lVar9 = blo[uVar10];
      lVar3 = alo[uVar10];
      dlo[uVar10] = (mlo[uVar10] + lVar9) - lVar3;
      dhi[uVar10] = (lVar9 - lVar3) + mhi[uVar10];
    }
    switch((int)local_180) {
    case 0x3e9:
    case 0x3ea:
      alpha = &d_one;
      d_one = 4.94065645841247e-324;
      break;
    case 0x3eb:
      alpha = &d_one;
      d_one = (double)CONCAT44(d_one._4_4_,0x3f800000);
      break;
    case 0x3ec:
      alpha = &d_one;
      d_one = 1.0;
      break;
    default:
      pnga_error("Type not supported",local_180);
      alpha = (double *)0x0;
      break;
    case 0x3ee:
      alpha = &d_one;
      d_one = 5.26354424712089e-315;
      break;
    case 0x3ef:
      alpha = &d_one;
      d_one = 1.0;
      uStack_190 = 0;
    }
    pnga_acc(IVar8,dlo,dhi,src_data_ptr,mld,alpha);
  }
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_merge_distr_patch(Integer g_a, Integer *alo, Integer *ahi,
                            Integer g_b, Integer *blo, Integer *bhi)
/*    Integer g_a  handle to mirrored array
      Integer *alo  indices of lower corner of mirrored array patch
      Integer *ahi  indices of upper corner of mirrored array patch
      Integer g_b  handle to distributed array
      Integer *blo  indices of lower corner of distributed array patch
      Integer *bhi  indices of upper corner of distributed array patch
*/
{
  Integer local_sync_begin, local_sync_end;
  Integer a_handle, b_handle, adim, bdim;
  Integer mlo[MAXDIM], mhi[MAXDIM], mld[MAXDIM];
  Integer dlo[MAXDIM], dhi[MAXDIM];
  char trans[2];
  double d_one;
  Integer type, i_one;
  double z_one[2];
  float  c_one[2];
  float f_one;
  long l_one;
  void *src_data_ptr;
  void *one = NULL;
  Integer i, idim, intersect, p_handle;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end = 1; /*remove any previous masking */
  if (local_sync_begin) pnga_sync();
  pnga_check_handle(g_a, "nga_merge_distr_patch");
  pnga_check_handle(g_b, "nga_merge_distr_patch");

  /* check to make sure that both patches lie within global arrays and
     that patches are the same dimensions */
  a_handle = GA_OFFSET + g_a;
  b_handle = GA_OFFSET + g_b;

  if (!pnga_is_mirrored(g_a)) {
    if (pnga_cluster_nnodes() > 1) {
      pnga_error("Handle to a non-mirrored array passed",0);
    } else {
      trans[0] = 'N';
      trans[1] = '\0';
      pnga_copy_patch(trans, g_a, alo, ahi, g_b, blo, bhi);
      return;
    }
  }

  if (pnga_is_mirrored(g_b) && pnga_cluster_nnodes())
    pnga_error("Distributed array is mirrored",0);

  adim = GA[a_handle].ndim;
  bdim = GA[b_handle].ndim;

  p_handle = GA[a_handle].p_handle;

  if (adim != bdim)
    pnga_error("Global arrays must have same dimension",0);

  type = GA[a_handle].type;
  if (type != GA[b_handle].type)
    pnga_error("Global arrays must be of same type",0);

  for (i=0; i<adim; i++) {
    idim = (Integer)GA[a_handle].dims[i];
    if (alo[i] < 0 || alo[i] >= idim || ahi[i] < 0 || ahi[i] >= idim ||
        alo[i] > ahi[i])
      pnga_error("Invalid patch index on mirrored GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = GA[b_handle].dims[i];
    if (blo[i] < 0 || blo[i] >= idim || bhi[i] < 0 || bhi[i] >= idim ||
        blo[i] > bhi[i])
      pnga_error("Invalid patch index on distributed GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = (Integer)GA[b_handle].dims[i];
    if (ahi[i] - alo[i] != bhi[i] - blo[i])
      pnga_error("Patch dimensions do not match for index ",i);
  }
  pnga_zero_patch(g_b, blo, bhi);

  /* Find coordinates of mirrored array patch that I own */
  i = PGRP_LIST[p_handle].map_proc_list[GAme];
  pnga_distribution(g_a, i, mlo, mhi);
  /* Check to see if mirrored array patch intersects my portion of
     mirrored array */
  intersect = 1;
  for (i=0; i<adim; i++) {
    if (mhi[i] < alo[i]) intersect = 0;
    if (mlo[i] > ahi[i]) intersect = 0;
  }
  if (intersect) {
    /* get portion of mirrored array patch that actually resides on this
       processor */
    for (i=0; i<adim; i++) {
      mlo[i] = GA_MAX(alo[i],mlo[i]);
      mhi[i] = GA_MIN(ahi[i],mhi[i]);
    }

    /* get pointer to locally held distribution */
    pnga_access_ptr(g_a, mlo, mhi, &src_data_ptr, mld);

    /* find indices in distributed array corresponding to this patch */
    for (i=0; i<adim; i++) {
      dlo[i] = blo[i] + mlo[i]-alo[i];
      dhi[i] = blo[i] + mhi[i]-alo[i];
    }

    /* perform accumulate */
    if (type == C_DBL) {
      d_one = 1.0;
      one = &d_one;
    } else if (type == C_DCPL) {
      z_one[0] = 1.0;
      z_one[1] = 0.0;
      one = &z_one;
    } else if (type == C_SCPL) {
      c_one[0] = 1.0;
      c_one[1] = 0.0;
      one = &c_one;
    } else if (type == C_FLOAT) {
      f_one = 1.0;
      one = &f_one;
    } else if (type == C_INT) {
      i_one = 1;
      one = &i_one;
    } else if (type == C_LONG) {
      l_one = 1;
      one = &l_one;
    } else {
      pnga_error("Type not supported",type);
    }
    pnga_acc(g_b, dlo, dhi, src_data_ptr, mld, one);
  }
  if (local_sync_end) pnga_sync();
}